

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setPartials
          (BeagleCPUImpl<float,_1,_0> *this,int bufferIndex,double *inPartials)

{
  void *pvVar1;
  double *in_RDX;
  int in_ESI;
  long in_RDI;
  int k_1;
  int k;
  int i;
  int l;
  float *tmpRealPartialsOffset;
  double *inPartialsOffset;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  float *local_30;
  double *local_28;
  int local_4;
  
  if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc) <= in_ESI)) {
    local_4 = -5;
  }
  else {
    if (*(long *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 8) == 0) {
      pvVar1 = malloc((long)*(int *)(in_RDI + 0x3c) << 2);
      *(void **)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 8) = pvVar1;
      if (*(long *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 8) == 0) {
        return -2;
      }
    }
    local_30 = *(float **)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 8);
    local_28 = in_RDX;
    for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x34); local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < *(int *)(in_RDI + 0x14); local_38 = local_38 + 1) {
        beagleMemCpy<float,double_const>(local_30,local_28,*(uint *)(in_RDI + 0x24));
        local_30 = local_30 + *(int *)(in_RDI + 0x24);
        for (local_3c = *(int *)(in_RDI + 0x24); local_3c < *(int *)(in_RDI + 0x2c);
            local_3c = local_3c + 1) {
          *local_30 = 0.0;
          local_30 = local_30 + 1;
        }
        local_28 = local_28 + *(int *)(in_RDI + 0x24);
      }
      for (local_40 = 0;
          local_40 < *(int *)(in_RDI + 0x2c) * (*(int *)(in_RDI + 0x18) - *(int *)(in_RDI + 0x14));
          local_40 = local_40 + 1) {
        *local_30 = 0.0;
        local_30 = local_30 + 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setPartials(int bufferIndex,
                               const double* inPartials) {
    if (bufferIndex < 0 || bufferIndex >= kBufferCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if (gPartials[bufferIndex] == NULL) {
        gPartials[bufferIndex] = (REALTYPE*) malloc(sizeof(REALTYPE) * kPartialsSize);
        if (gPartials[bufferIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }

    const double* inPartialsOffset = inPartials;
    REALTYPE* tmpRealPartialsOffset = gPartials[bufferIndex];
    for (int l = 0; l < kCategoryCount; l++) {
        for (int i = 0; i < kPatternCount; i++) {
            beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
            tmpRealPartialsOffset += kStateCount;
            // Pad extra buffer with zeros
            for(int k = kStateCount; k < kPartialsPaddedStateCount; k++) {
                *tmpRealPartialsOffset++ = 0;
            }
            inPartialsOffset += kStateCount;
        }
        // Pad extra buffer with zeros
        for(int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
            *tmpRealPartialsOffset++ = 0;
        }
    }

    return BEAGLE_SUCCESS;
}